

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBasicDrawTests.cpp
# Opt level: O1

void __thiscall
vkt::Draw::anon_unknown_0::DrawTestInstance<vkt::Draw::(anonymous_namespace)::DrawIndirectParams>::
generateDrawData(DrawTestInstance<vkt::Draw::(anonymous_namespace)::DrawIndirectParams> *this)

{
  pointer pPVar1;
  size_type __n;
  long lVar2;
  ulong uVar3;
  uint uVar4;
  pointer pVVar5;
  pointer pPVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  VecAccess<float,_4,_4> colorAccess;
  VecAccess<float,_4,_4> positionAccess;
  Random rnd;
  DrawTestInstance<vkt::Draw::(anonymous_namespace)::DrawIndirectParams> *local_98;
  undefined1 local_90 [8];
  pointer local_88;
  pointer pPStack_80;
  float local_78 [4];
  value_type local_68;
  deRandom local_40;
  
  pVVar5 = (this->m_data).commands.
           super__Vector_base<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>
           ._M_impl.super__Vector_impl_data._M_start;
  deRandom_init(&local_40,pVVar5->vertexCount ^ pVVar5->firstVertex ^ 0xc2a39f);
  __n = 0;
  for (pVVar5 = (this->m_data).commands.
                super__Vector_base<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pVVar5 != (this->m_data).commands.
                super__Vector_base<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>
                ._M_impl.super__Vector_impl_data._M_finish; pVVar5 = pVVar5 + 1) {
    uVar4 = pVVar5->vertexCount + pVVar5->firstVertex;
    uVar3 = (ulong)uVar4;
    if (uVar4 <= (uint)__n) {
      uVar3 = __n;
    }
    __n = uVar3;
  }
  local_68.position.m_data[0] = 0.0;
  local_68.position.m_data[1] = 0.0;
  local_68.position.m_data[2] = 0.0;
  local_68.position.m_data[3] = 0.0;
  local_68.color.m_data[0] = 0.0;
  local_68.color.m_data[1] = 0.0;
  local_68.color.m_data[2] = 0.0;
  local_68.color.m_data[3] = 0.0;
  local_98 = this;
  std::vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>::
  vector((vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_> *)
         local_90,__n,&local_68,(allocator_type *)local_78);
  std::vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>::
  _M_move_assign((vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                  *)&this->m_data,
                 (vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                  *)local_90);
  if (local_90 != (undefined1  [8])0x0) {
    operator_delete((void *)local_90,(long)pPStack_80 - (long)local_90);
  }
  pVVar5 = (local_98->m_data).commands.
           super__Vector_base<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pVVar5 != (local_98->m_data).commands.
                super__Vector_base<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      if (pVVar5->vertexCount != 0) {
        uVar4 = pVVar5->firstVertex;
        pPVar1 = (this->m_data).super_DrawParamsBase.vertices.
                 super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar3 = 0;
        do {
          pPVar6 = pPVar1 + uVar4 + uVar3;
          local_68.position.m_data[2] = 0.0;
          local_68.position.m_data[3] = 1.4013e-45;
          local_68.color.m_data[0] = 2.8026e-45;
          local_68.color.m_data[1] = 4.2039e-45;
          local_68.position.m_data._0_8_ = pPVar6;
          fVar7 = deRandom_getFloat(&local_40);
          fVar8 = deRandom_getFloat(&local_40);
          local_90._4_4_ = fVar8 + fVar8 + -1.0;
          local_90._0_4_ = fVar7 + fVar7 + -1.0;
          local_88 = (pointer)0x3f8000003f800000;
          lVar2 = 2;
          do {
            *(undefined4 *)
             ((long)&pPVar6->position + (long)(int)local_68.position.m_data[lVar2] * 4) =
                 *(undefined4 *)((long)&local_98 + lVar2 * 4);
            lVar2 = lVar2 + 1;
          } while (lVar2 != 6);
          local_88 = (pointer)0x100000000;
          pPStack_80 = (pointer)0x300000002;
          local_90 = (undefined1  [8])&pPVar6->color;
          fVar7 = deRandom_getFloat(&local_40);
          fVar8 = deRandom_getFloat(&local_40);
          fVar9 = deRandom_getFloat(&local_40);
          fVar10 = deRandom_getFloat(&local_40);
          local_78[0] = fVar7 + 0.0;
          local_78[1] = fVar8 + 0.0;
          local_78[2] = fVar9 + 0.0;
          local_78[3] = fVar10 + 0.0;
          lVar2 = 2;
          do {
            (((pointer)&pPVar6->color)->position).m_data[*(int *)(local_90 + lVar2 * 4)] =
                 local_78[lVar2 + -2];
            lVar2 = lVar2 + 1;
          } while (lVar2 != 6);
          uVar3 = uVar3 + 1;
        } while (uVar3 < pVVar5->vertexCount);
      }
      pVVar5 = pVVar5 + 1;
    } while (pVVar5 != (local_98->m_data).commands.
                       super__Vector_base<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void DrawTestInstance<DrawIndirectParams>::generateDrawData (void)
{
	de::Random	rnd(SEED ^ m_data.commands[0].vertexCount ^ m_data.commands[0].firstVertex);

	deUint32 lastIndex	= 0;

	// Find the interval which will be used
	for (std::vector<vk::VkDrawIndirectCommand>::const_iterator it = m_data.commands.begin(); it != m_data.commands.end(); ++it)
	{
		const deUint32	index = it->firstVertex + it->vertexCount;
		lastIndex	= (index > lastIndex) ? index : lastIndex;
	}

	// Initialize with zeros
	m_data.vertices = std::vector<PositionColorVertex>(lastIndex, PositionColorVertex(tcu::Vec4(0.0, 0.0, 0.0, 0.0), tcu::Vec4(0.0, 0.0, 0.0, 0.0)));

	// Generate random vertices only where necessary
	for (std::vector<vk::VkDrawIndirectCommand>::const_iterator it = m_data.commands.begin(); it != m_data.commands.end(); ++it)
	{
		std::vector<PositionColorVertex>::iterator vertexStart = m_data.vertices.begin() + it->firstVertex;

		for (deUint32 idx = 0; idx < it->vertexCount; ++idx)
		{
			std::vector<PositionColorVertex>::iterator vertexIt = vertexStart + idx;

			tcu::VecAccess<float, 4, 4> positionAccess = vertexIt->position.xyzw();
			positionAccess = tcu::Vec4(rnd.getFloat(-1.0, 1.0), rnd.getFloat(-1.0, 1.0), 1.0, 1.0);

			tcu::VecAccess<float, 4, 4> colorAccess = vertexIt->color.xyzw();
			colorAccess = tcu::Vec4(rnd.getFloat(0.0, 1.0), rnd.getFloat(0.0, 1.0), rnd.getFloat(0.0, 1.0), rnd.getFloat(0.0, 1.0));
		}
	}
}